

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

int cimg_library::cimg::strncasecmp(char *__s1,char *__s2,size_t __n)

{
  char cVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  int local_4c;
  int local_40;
  int local_3c;
  int diff;
  int k;
  char *nstr2;
  char *nstr1;
  int l_local;
  char *str2_local;
  char *str1_local;
  
  iVar3 = (int)__n;
  if (iVar3 == 0) {
    str1_local._4_4_ = 0;
  }
  else if (__s1 == (char *)0x0) {
    str1_local._4_4_ = 0;
    if (__s2 != (char *)0x0) {
      str1_local._4_4_ = -1;
    }
  }
  else {
    local_40 = 0;
    local_3c = 0;
    _diff = __s2;
    nstr2 = __s1;
    while( true ) {
      bVar4 = false;
      if (local_3c < iVar3) {
        cVar1 = uncase(*nstr2);
        cVar2 = uncase(*_diff);
        local_40 = (int)cVar1 - (int)cVar2;
        bVar4 = local_40 == 0;
      }
      if (!bVar4) break;
      nstr2 = nstr2 + 1;
      _diff = _diff + 1;
      local_3c = local_3c + 1;
    }
    if (local_3c == iVar3) {
      local_4c = 0;
    }
    else {
      local_4c = local_40;
    }
    str1_local._4_4_ = local_4c;
  }
  return str1_local._4_4_;
}

Assistant:

inline int strncasecmp(const char *const str1, const char *const str2, const int l) {
      if (!l) return 0;
      if (!str1) return str2?-1:0;
      const char *nstr1 = str1, *nstr2 = str2;
      int k, diff = 0; for (k = 0; k<l && !(diff = uncase(*nstr1)-uncase(*nstr2)); ++k) { ++nstr1; ++nstr2; }
      return k!=l?diff:0;
    }